

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

bool __thiscall
libtorrent::torrent_info::parse_torrent_file
          (torrent_info *this,bdecode_node *torrent_file,error_code *ec,load_torrent_limits *cfg)

{
  vector<announce_entry> *this_00;
  string *psVar1;
  bool bVar2;
  type_t tVar3;
  int iVar4;
  int iVar5;
  int64_t iVar6;
  char *pcVar7;
  bdecode_token *pbVar8;
  byte bVar9;
  int iVar10;
  int i;
  error_code *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  error_code eVar11;
  string_view sVar12;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view uri;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view url_00;
  string_view url_01;
  bdecode_node url_seeds;
  bdecode_node nodes;
  bdecode_node similar;
  bdecode_node url_1;
  bdecode_node announce_node;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique;
  bdecode_node collections;
  bdecode_node info;
  add_torrent_params p;
  int local_634;
  bdecode_node local_630;
  string local_5f0;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *local_5d0;
  bdecode_node local_5c8;
  string local_588;
  bdecode_node local_568;
  bdecode_node local_528;
  string local_4e8;
  string local_4c8;
  bdecode_node local_4a8;
  bdecode_token local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  bdecode_node local_418;
  headers_t local_3d8;
  bdecode_node local_3c0;
  undefined1 local_380 [48];
  undefined1 local_350 [40];
  uint8_t local_328;
  uint8_t local_327;
  byte local_326;
  uint local_25c [2];
  uint auStack_254 [4];
  uint auStack_244 [2];
  uint local_23c [2];
  uint auStack_234 [2];
  uint local_22c;
  
  tVar3 = bdecode_node::type(torrent_file);
  if (tVar3 != dict_t) {
    eVar11 = errors::make_error_code(torrent_is_no_dict);
    ec->val_ = eVar11.val_;
    ec->failed_ = eVar11.failed_;
    *(int3 *)&ec->field_0x5 = eVar11._5_3_;
    ec->cat_ = eVar11.cat_;
    return false;
  }
  sVar12._M_str = "info";
  sVar12._M_len = 4;
  bdecode_node::dict_find_dict(&local_3c0,torrent_file,sVar12);
  bVar2 = bdecode_node::operator_cast_to_bool(&local_3c0);
  if (!bVar2) {
    key_07._M_str = "magnet-uri";
    key_07._M_len = 10;
    bdecode_node::dict_find_string(&local_568,torrent_file,key_07);
    bVar2 = bdecode_node::operator_cast_to_bool(&local_568);
    if (bVar2) {
      sVar12 = bdecode_node::string_value(&local_568);
      uri._M_len = sVar12._M_str;
      uri._M_str = (char *)ec;
      parse_magnet_uri((add_torrent_params *)local_380,(libtorrent *)sVar12._M_len,uri,in_R8);
      bVar2 = ec->failed_;
      if (bVar2 == false) {
        (this->m_info_hash).v2.m_number._M_elems[7] = local_22c;
        *(uint (*) [2])((this->m_info_hash).v2.m_number._M_elems + 3) = local_23c;
        *(uint (*) [2])((this->m_info_hash).v2.m_number._M_elems + 5) = auStack_234;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = auStack_254._8_8_;
        *(uint (*) [2])((this->m_info_hash).v2.m_number._M_elems + 1) = auStack_244;
        *(uint (*) [2])(this->m_info_hash).v1.m_number._M_elems = local_25c;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = auStack_254._0_8_;
        ::std::
        vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ::reserve(&(this->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                  ,((long)(local_380._32_8_ - local_380._24_8_) >> 5) +
                   ((long)(this->m_urls).
                          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          .
                          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_urls).
                          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          .
                          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
        for (; local_380._24_8_ != local_380._32_8_; local_380._24_8_ = local_380._24_8_ + 0x20) {
          ::std::
          vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
          ::emplace_back<std::__cxx11::string_const&>
                    ((vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
                      *)&this->m_urls,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_380._24_8_);
        }
      }
      bVar9 = bVar2 ^ 1;
      add_torrent_params::~add_torrent_params((add_torrent_params *)local_380);
    }
    else {
      eVar11 = errors::make_error_code(torrent_missing_info);
      ec->val_ = eVar11.val_;
      ec->failed_ = eVar11.failed_;
      *(int3 *)&ec->field_0x5 = eVar11._5_3_;
      ec->cat_ = eVar11.cat_;
      bVar9 = 0;
    }
    if (local_568.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_568.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_568.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_568.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_00365f8c;
  }
  bVar2 = parse_info_section(this,&local_3c0,ec,cfg->max_pieces);
  if ((bVar2) && (bVar2 = resolve_duplicate_filenames(this,cfg->max_duplicate_filenames,ec), bVar2))
  {
    bVar2 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
    if (!bVar2) {
      key_05._M_str = "piece layers";
      key_05._M_len = 0xc;
      bdecode_node::dict_find_dict((bdecode_node *)local_380,torrent_file,key_05);
      bVar2 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_380);
      if ((bVar2) && (bVar2 = parse_piece_layers(this,(bdecode_node *)local_380,ec), !bVar2)) {
        (this->m_files).m_piece_length = 0;
        if ((bdecode_token *)local_380._0_8_ != (bdecode_token *)0x0) {
          operator_delete((void *)local_380._0_8_,local_380._16_8_ - local_380._0_8_);
        }
        goto LAB_00365f8a;
      }
      if ((bdecode_token *)local_380._0_8_ != (bdecode_token *)0x0) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ - local_380._0_8_);
      }
    }
    key_06._M_str = "similar";
    key_06._M_len = 7;
    bdecode_node::dict_find_list(&local_568,torrent_file,key_06);
    bVar2 = bdecode_node::operator_cast_to_bool(&local_568);
    if (bVar2) {
      for (iVar10 = 0; iVar4 = bdecode_node::list_size(&local_568), iVar10 < iVar4;
          iVar10 = iVar10 + 1) {
        bdecode_node::list_at((bdecode_node *)local_380,&local_568,iVar10);
        tVar3 = bdecode_node::type((bdecode_node *)local_380);
        if ((bdecode_token *)local_380._0_8_ != (bdecode_token *)0x0) {
          operator_delete((void *)local_380._0_8_,local_380._16_8_ - local_380._0_8_);
        }
        if (tVar3 == string_t) {
          bdecode_node::list_at((bdecode_node *)local_380,&local_568,iVar10);
          iVar4 = bdecode_node::string_length((bdecode_node *)local_380);
          if ((bdecode_token *)local_380._0_8_ != (bdecode_token *)0x0) {
            operator_delete((void *)local_380._0_8_,local_380._16_8_ - local_380._0_8_);
          }
          if (iVar4 == 0x14) {
            bdecode_node::list_at((bdecode_node *)local_380,&local_568,iVar10);
            local_418.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)bdecode_node::string_ptr((bdecode_node *)local_380);
            ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
            emplace_back<char_const*>
                      ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                        *)&this->m_owned_similar_torrents,(char **)&local_418);
            if ((bdecode_token *)local_380._0_8_ != (bdecode_token *)0x0) {
              operator_delete((void *)local_380._0_8_,local_380._16_8_ - local_380._0_8_);
            }
          }
        }
      }
    }
    key_08._M_str = "collections";
    key_08._M_len = 0xb;
    bdecode_node::dict_find_list(&local_418,torrent_file,key_08);
    bVar2 = bdecode_node::operator_cast_to_bool(&local_418);
    if (bVar2) {
      for (iVar10 = 0; iVar4 = bdecode_node::list_size(&local_418), iVar10 < iVar4;
          iVar10 = iVar10 + 1) {
        bdecode_node::list_at((bdecode_node *)local_380,&local_418,iVar10);
        tVar3 = bdecode_node::type((bdecode_node *)local_380);
        if (tVar3 == string_t) {
          local_4a8.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)bdecode_node::string_ptr((bdecode_node *)local_380);
          iVar4 = bdecode_node::string_length((bdecode_node *)local_380);
          local_5c8.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)iVar4;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*,unsigned_long>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->m_owned_collections,(char **)&local_4a8,(unsigned_long *)&local_5c8);
        }
        if ((bdecode_token *)local_380._0_8_ != (bdecode_token *)0x0) {
          operator_delete((void *)local_380._0_8_,local_380._16_8_ - local_380._0_8_);
        }
      }
    }
    key_09._M_str = "announce-list";
    key_09._M_len = 0xd;
    bdecode_node::dict_find_list(&local_4a8,torrent_file,key_09);
    bVar2 = bdecode_node::operator_cast_to_bool(&local_4a8);
    if (bVar2) {
      iVar10 = bdecode_node::list_size(&local_4a8);
      this_00 = &this->m_urls;
      ::std::
      vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>::
      reserve(&this_00->
               super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              ,(long)iVar10);
      iVar10 = bdecode_node::list_size(&local_4a8);
      if (0 < iVar10) {
        iVar4 = 0;
        do {
          bdecode_node::list_at(&local_5c8,&local_4a8,iVar4);
          tVar3 = bdecode_node::type(&local_5c8);
          if ((tVar3 == list_t) && (iVar5 = bdecode_node::list_size(&local_5c8), 0 < iVar5)) {
            i = 0;
            do {
              sVar12 = bdecode_node::list_string_value_at(&local_5c8,i,(string_view)ZEXT816(0));
              v1_2::announce_entry::announce_entry((announce_entry *)local_380,sVar12);
              aux::ltrim((string *)local_380);
              if ((element_type *)local_380._8_8_ != (element_type *)0x0) {
                local_328 = (uint8_t)iVar4;
                local_327 = '\0';
                local_326 = (local_326 & 0xf0) + 1;
                bVar2 = aux::is_i2p_url((string *)local_380);
                if (bVar2) {
                  (this->m_flags).m_val = (this->m_flags).m_val | 4;
                }
                ::std::
                vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                ::push_back(&this_00->
                             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                            ,(announce_entry *)local_380);
              }
              v1_2::announce_entry::~announce_entry((announce_entry *)local_380);
              i = i + 1;
            } while (iVar5 != i);
          }
          if (local_5c8.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_5c8.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_5c8.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_5c8.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 != iVar10);
      }
      if ((this->m_urls).
          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          .
          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->m_urls).
          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          .
          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        aux::
        random_shuffle<libtorrent::aux::container_wrapper<libtorrent::v1_2::announce_entry,int,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>>
                  (this_00);
        ::std::
        stable_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,libtorrent::torrent_info::parse_torrent_file(libtorrent::bdecode_node_const&,boost::system::error_code&,libtorrent::load_torrent_limits_const&)::__0>
                  ((this->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   .
                   super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (this->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   .
                   super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if ((this->m_urls).
        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        .
        super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_urls).
        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        .
        super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      key._M_str = "announce";
      key._M_len = 8;
      sVar12 = bdecode_node::dict_find_string_value(torrent_file,key,(string_view)ZEXT816(0));
      v1_2::announce_entry::announce_entry((announce_entry *)local_380,sVar12);
      local_327 = '\0';
      local_326 = (local_326 & 0xf0) + 1;
      aux::ltrim((string *)local_380);
      bVar2 = aux::is_i2p_url((string *)local_380);
      if (bVar2) {
        (this->m_flags).m_val = (this->m_flags).m_val | 4;
      }
      if ((element_type *)local_380._8_8_ != (element_type *)0x0) {
        ::std::
        vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ::push_back(&(this->m_urls).
                     super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                    ,(value_type *)local_380);
      }
      v1_2::announce_entry::~announce_entry((announce_entry *)local_380);
    }
    key_10._M_str = "nodes";
    key_10._M_len = 5;
    bdecode_node::dict_find_list(&local_5c8,torrent_file,key_10);
    bVar2 = bdecode_node::operator_cast_to_bool(&local_5c8);
    if ((bVar2) && (iVar10 = bdecode_node::list_size(&local_5c8), 0 < iVar10)) {
      iVar4 = 0;
      do {
        bdecode_node::list_at((bdecode_node *)local_380,&local_5c8,iVar4);
        tVar3 = bdecode_node::type((bdecode_node *)local_380);
        if ((tVar3 == list_t) &&
           (iVar5 = bdecode_node::list_size((bdecode_node *)local_380), 1 < iVar5)) {
          bdecode_node::list_at(&local_630,(bdecode_node *)local_380,0);
          tVar3 = bdecode_node::type(&local_630);
          bVar2 = true;
          if (tVar3 == string_t) {
            bdecode_node::list_at(&local_528,(bdecode_node *)local_380,1);
            tVar3 = bdecode_node::type(&local_528);
            bVar2 = tVar3 != int_t;
            if (local_528.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_528.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (local_630.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_630.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_630.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_630.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar2) {
            bdecode_node::list_at(&local_630,(bdecode_node *)local_380,0);
            local_448._M_impl._0_16_ = bdecode_node::string_value(&local_630);
            bdecode_node::list_at(&local_528,(bdecode_node *)local_380,1);
            iVar6 = bdecode_node::int_value(&local_528);
            local_634 = (int)iVar6;
            ::std::
            vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
            ::emplace_back<std::basic_string_view<char,std::char_traits<char>>,int>
                      ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                        *)&this->m_nodes,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_448,&local_634);
            if (local_528.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_528.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_630.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_630.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_630.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_630.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        if ((bdecode_token *)local_380._0_8_ != (bdecode_token *)0x0) {
          operator_delete((void *)local_380._0_8_,local_380._16_8_ - local_380._0_8_);
        }
        iVar4 = iVar4 + 1;
      } while (iVar10 != iVar4);
    }
    key_00._M_str = "creation date";
    key_00._M_len = 0xd;
    iVar6 = bdecode_node::dict_find_int_value(torrent_file,key_00,-1);
    if (-1 < iVar6) {
      this->m_creation_date = iVar6;
    }
    key_11._M_str = "url-list";
    key_11._M_len = 8;
    pcVar7 = "url-list";
    bdecode_node::dict_find(&local_630,torrent_file,key_11);
    bVar2 = bdecode_node::operator_cast_to_bool(&local_630);
    if (((bVar2) && (tVar3 = bdecode_node::type(&local_630), tVar3 == string_t)) &&
       (iVar10 = bdecode_node::string_length(&local_630), 0 < iVar10)) {
      sVar12 = bdecode_node::string_value(&local_630);
      url_00._M_len = sVar12._M_str;
      url_00._M_str = pcVar7;
      maybe_url_encode_abi_cxx11_(&local_4c8,(libtorrent *)sVar12._M_len,url_00);
      local_4e8._M_string_length = 0;
      local_4e8.field_2._M_local_buf[0] = '\0';
      local_3d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      web_seed_entry::web_seed_entry((web_seed_entry *)local_380,&local_4c8,&local_4e8,&local_3d8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_3d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,
                        CONCAT71(local_4e8.field_2._M_allocated_capacity._1_7_,
                                 local_4e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      if (((((this->m_flags).m_val & 1) != 0) &&
          (iVar10 = file_storage::num_files(&this->m_files), 1 < iVar10)) &&
         (((element_type *)local_380._8_8_ == (element_type *)0x0 ||
          (((pointer)(local_380._0_8_ + -1))[local_380._8_8_] != '/')))) {
        ::std::__cxx11::string::push_back((char)local_380);
      }
      ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::
      emplace_back<libtorrent::web_seed_entry>(&this->m_web_seeds,(web_seed_entry *)local_380);
      web_seed_entry::~web_seed_entry((web_seed_entry *)local_380);
    }
    else {
      bVar2 = bdecode_node::operator_cast_to_bool(&local_630);
      if ((bVar2) && (tVar3 = bdecode_node::type(&local_630), tVar3 == list_t)) {
        local_448._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_448._M_impl.super__Rb_tree_header._M_header;
        local_448._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        pbVar8 = (bdecode_token *)0x0;
        local_448._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_448._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_448._M_impl.super__Rb_tree_header._M_header._M_right =
             local_448._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar10 = bdecode_node::list_size(&local_630);
        if (0 < iVar10) {
          local_5d0 = &this->m_web_seeds;
          iVar4 = 0;
          do {
            bdecode_node::list_at(&local_528,&local_630,iVar4);
            tVar3 = bdecode_node::type(&local_528);
            if ((tVar3 == string_t) && (iVar5 = bdecode_node::string_length(&local_528), iVar5 != 0)
               ) {
              sVar12 = bdecode_node::string_value(&local_528);
              url_01._M_len = sVar12._M_str;
              url_01._M_str = (char *)pbVar8;
              maybe_url_encode_abi_cxx11_(&local_588,(libtorrent *)sVar12._M_len,url_01);
              local_5f0._M_string_length = 0;
              local_5f0.field_2._M_local_buf[0] = '\0';
              local_468 = (bdecode_token)0x0;
              uStack_460 = 0;
              local_458 = 0;
              pbVar8 = &local_468;
              local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
              web_seed_entry::web_seed_entry
                        ((web_seed_entry *)local_380,&local_588,&local_5f0,(headers_t *)&local_468);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_468);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
                operator_delete(local_5f0._M_dataplus._M_p,
                                CONCAT71(local_5f0.field_2._M_allocated_capacity._1_7_,
                                         local_5f0.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                local_588.field_2._M_allocated_capacity + 1);
              }
              if (((((this->m_flags).m_val & 1) != 0) &&
                  (iVar5 = file_storage::num_files(&this->m_files), 1 < iVar5)) &&
                 (((element_type *)local_380._8_8_ == (element_type *)0x0 ||
                  (pbVar8 = (bdecode_token *)local_380._0_8_,
                  ((pointer)(local_380._0_8_ + -1))[local_380._8_8_] != '/')))) {
                ::std::__cxx11::string::push_back((char)local_380);
              }
              pVar13 = ::std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)&local_448,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_380);
              if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                ::std::
                vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::
                emplace_back<libtorrent::web_seed_entry>(local_5d0,(web_seed_entry *)local_380);
              }
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_350 + 0x10));
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_380._32_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350) {
                operator_delete((void *)local_380._32_8_,local_350._0_8_ + 1);
              }
              if ((bdecode_token *)local_380._0_8_ != (bdecode_token *)(local_380 + 0x10)) {
                operator_delete((void *)local_380._0_8_,(ulong)(local_380._16_8_ + 1));
              }
            }
            if (local_528.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_528.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            iVar4 = iVar4 + 1;
          } while (iVar10 != iVar4);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_448);
      }
    }
    key_01._M_str = "comment.utf-8";
    key_01._M_len = 0xd;
    sVar12 = bdecode_node::dict_find_string_value(torrent_file,key_01,(string_view)ZEXT816(0));
    psVar1 = &this->m_comment;
    ::std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->m_comment)._M_string_length,(ulong)sVar12._M_str);
    if ((this->m_comment)._M_string_length == 0) {
      key_02._M_str = "comment";
      key_02._M_len = 7;
      sVar12 = bdecode_node::dict_find_string_value(torrent_file,key_02,(string_view)ZEXT816(0));
      ::std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(this->m_comment)._M_string_length,(ulong)sVar12._M_str);
    }
    aux::verify_encoding(psVar1);
    key_03._M_str = "created by.utf-8";
    key_03._M_len = 0x10;
    sVar12 = bdecode_node::dict_find_string_value(torrent_file,key_03,(string_view)ZEXT816(0));
    psVar1 = &this->m_created_by;
    ::std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->m_created_by)._M_string_length,(ulong)sVar12._M_str);
    if ((this->m_created_by)._M_string_length == 0) {
      key_04._M_str = "created by";
      key_04._M_len = 10;
      sVar12 = bdecode_node::dict_find_string_value(torrent_file,key_04,(string_view)ZEXT816(0));
      ::std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(this->m_created_by)._M_string_length,(ulong)sVar12._M_str)
      ;
    }
    aux::verify_encoding(psVar1);
    if (local_630.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_630.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_630.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_630.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_5c8.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5c8.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_5c8.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5c8.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4a8.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4a8.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4a8.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4a8.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_418.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_418.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_418.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_418.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_568.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_568.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_568.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_568.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar9 = 1;
  }
  else {
LAB_00365f8a:
    bVar9 = 0;
  }
LAB_00365f8c:
  if (local_3c0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)bVar9;
}

Assistant:

bool torrent_info::parse_torrent_file(bdecode_node const& torrent_file
		, error_code& ec, load_torrent_limits const& cfg)
	{
		if (torrent_file.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_is_no_dict;
			return false;
		}

		bdecode_node const info = torrent_file.dict_find_dict("info");
		if (!info)
		{
			bdecode_node const uri = torrent_file.dict_find_string("magnet-uri");
			if (uri)
			{
				auto const p = parse_magnet_uri(uri.string_value(), ec);
				if (ec) return false;

				m_info_hash = p.info_hashes;
				m_urls.reserve(m_urls.size() + p.trackers.size());
				for (auto const& url : p.trackers)
					m_urls.emplace_back(url);

				return true;
			}

			ec = errors::torrent_missing_info;
			return false;
		}

		if (!parse_info_section(info, ec, cfg.max_pieces)) return false;
		if (!resolve_duplicate_filenames(cfg.max_duplicate_filenames, ec)) return false;

		if (m_info_hash.has_v2())
		{
			// allow torrent files without piece layers, just like we allow magnet
			// links. However, if there are piece layers, make sure they're
			// valid
			bdecode_node const& e = torrent_file.dict_find_dict("piece layers");
			if (e && !parse_piece_layers(e, ec))
			{
				TORRENT_ASSERT(ec);
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
		}

#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		bdecode_node const similar = torrent_file.dict_find_list("similar");
		if (similar)
		{
			for (int i = 0; i < similar.list_size(); ++i)
			{
				if (similar.list_at(i).type() != bdecode_node::string_t)
					continue;

				if (similar.list_at(i).string_length() != 20)
					continue;

				m_owned_similar_torrents.emplace_back(
					similar.list_at(i).string_ptr());
			}
		}

		bdecode_node const collections = torrent_file.dict_find_list("collections");
		if (collections)
		{
			for (int i = 0; i < collections.list_size(); ++i)
			{
				bdecode_node const str = collections.list_at(i);

				if (str.type() != bdecode_node::string_t) continue;

				m_owned_collections.emplace_back(str.string_ptr()
					, aux::numeric_cast<std::size_t>(str.string_length()));
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

		// extract the url of the tracker
		bdecode_node const announce_node = torrent_file.dict_find_list("announce-list");
		if (announce_node)
		{
			m_urls.reserve(announce_node.list_size());
			for (int j = 0, end(announce_node.list_size()); j < end; ++j)
			{
				bdecode_node const tier = announce_node.list_at(j);
				if (tier.type() != bdecode_node::list_t) continue;
				for (int k = 0, end2(tier.list_size()); k < end2; ++k)
				{
					announce_entry e(tier.list_string_value_at(k));
					aux::ltrim(e.url);
					if (e.url.empty()) continue;
					e.tier = std::uint8_t(j);
					e.fail_limit = 0;
					e.source = announce_entry::source_torrent;
#if TORRENT_USE_I2P
					if (aux::is_i2p_url(e.url)) m_flags |= i2p;
#endif
					m_urls.push_back(e);
				}
			}

			if (!m_urls.empty())
			{
				// shuffle each tier
				aux::random_shuffle(m_urls);
				std::stable_sort(m_urls.begin(), m_urls.end()
					, [](announce_entry const& lhs, announce_entry const& rhs)
					{ return lhs.tier < rhs.tier; });
			}
		}

		if (m_urls.empty())
		{
			announce_entry e(torrent_file.dict_find_string_value("announce"));
			e.fail_limit = 0;
			e.source = announce_entry::source_torrent;
			aux::ltrim(e.url);
#if TORRENT_USE_I2P
			if (aux::is_i2p_url(e.url)) m_flags |= i2p;
#endif
			if (!e.url.empty()) m_urls.push_back(e);
		}

		bdecode_node const nodes = torrent_file.dict_find_list("nodes");
		if (nodes)
		{
			for (int i = 0, end(nodes.list_size()); i < end; ++i)
			{
				bdecode_node const n = nodes.list_at(i);
				if (n.type() != bdecode_node::list_t
					|| n.list_size() < 2
					|| n.list_at(0).type() != bdecode_node::string_t
					|| n.list_at(1).type() != bdecode_node::int_t)
					continue;
				m_nodes.emplace_back(
					n.list_at(0).string_value()
					, int(n.list_at(1).int_value()));
			}
		}

		// extract creation date
		std::int64_t const cd = torrent_file.dict_find_int_value("creation date", -1);
		if (cd >= 0)
		{
			m_creation_date = std::time_t(cd);
		}

		// if there are any url-seeds, extract them
		bdecode_node const url_seeds = torrent_file.dict_find("url-list");
		if (url_seeds && url_seeds.type() == bdecode_node::string_t
			&& url_seeds.string_length() > 0)
		{
			web_seed_entry ent(maybe_url_encode(url_seeds.string_value()));
			if ((m_flags & multifile) && num_files() > 1)
				aux::ensure_trailing_slash(ent.url);
			m_web_seeds.push_back(std::move(ent));
		}
		else if (url_seeds && url_seeds.type() == bdecode_node::list_t)
		{
			// only add a URL once
			std::set<std::string> unique;
			for (int i = 0, end(url_seeds.list_size()); i < end; ++i)
			{
				bdecode_node const url = url_seeds.list_at(i);
				if (url.type() != bdecode_node::string_t) continue;
				if (url.string_length() == 0) continue;
				web_seed_entry ent(maybe_url_encode(url.string_value()));
				if ((m_flags & multifile) && num_files() > 1)
					aux::ensure_trailing_slash(ent.url);
				if (!unique.insert(ent.url).second) continue;
				m_web_seeds.push_back(std::move(ent));
			}
		}

		m_comment = torrent_file.dict_find_string_value("comment.utf-8");
		if (m_comment.empty()) m_comment = torrent_file.dict_find_string_value("comment");
		aux::verify_encoding(m_comment);

		m_created_by = torrent_file.dict_find_string_value("created by.utf-8");
		if (m_created_by.empty()) m_created_by = torrent_file.dict_find_string_value("created by");
		aux::verify_encoding(m_created_by);

		return true;
	}